

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

float * Gia_ManGenerateDelayTableFloat(int nIns,int nOuts)

{
  float *pfVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar3 = nOuts * nIns;
  pfVar1 = (float *)malloc((long)(int)uVar3 * 4 + 0xc);
  *pfVar1 = 0.0;
  pfVar1[1] = (float)nIns;
  pfVar1[2] = (float)nOuts;
  if ((int)uVar3 < 1) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      pfVar1[uVar2 + 3] = 1.0;
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  pfVar1[((int)uVar2 - nIns) + 3] = -1e+09;
  return pfVar1;
}

Assistant:

float * Gia_ManGenerateDelayTableFloat( int nIns, int nOuts )
{
    int i, Total = nIns * nOuts;
    float * pDelayTable = ABC_ALLOC( float, Total + 3 );
    pDelayTable[0] = 0;
    pDelayTable[1] = nIns;
    pDelayTable[2] = nOuts;
    for ( i = 0; i < Total; i++ )
        pDelayTable[i+3] = 1;
    pDelayTable[i+3 - nIns] = -ABC_INFINITY;
    return pDelayTable;
}